

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

void __thiscall
MipsOpcodeFormatter::handleImmediate
          (MipsOpcodeFormatter *this,MipsImmediateType type,uint originalValue,uint opcodeFlags)

{
  uint local_38;
  float local_34;
  string local_30;
  
  local_38 = originalValue;
  if (type == Immediate16) {
    if ((short)originalValue < 0 && (char)((opcodeFlags & 2) >> 1) == '\0') {
      local_34 = (float)(0x10000 - (originalValue & 0xffff));
      tinyformat::format<unsigned_int>(&local_30,"-0x%X",(uint *)&local_34);
      std::__cxx11::string::append((string *)this);
    }
    else {
      tinyformat::format<unsigned_int>(&local_30,"0x%X",&local_38);
      std::__cxx11::string::append((string *)this);
    }
  }
  else if (type == ImmediateHalfFloat) {
    local_34 = bitsToFloat(originalValue);
    tinyformat::format<float>(&local_30,"%f",&local_34);
    std::__cxx11::string::append((string *)this);
  }
  else {
    tinyformat::format<unsigned_int>(&local_30,"0x%X",&local_38);
    std::__cxx11::string::append((string *)this);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void MipsOpcodeFormatter::handleImmediate(MipsImmediateType type, unsigned int originalValue, unsigned int opcodeFlags)
{
	switch (type)
	{
	case MipsImmediateType::ImmediateHalfFloat:
		buffer += tfm::format("%f", bitsToFloat(originalValue));
		break;
	case MipsImmediateType::Immediate16:
		if (!(opcodeFlags & MO_IPCR) && originalValue & 0x8000)
			buffer += tfm::format("-0x%X", 0x10000-(originalValue & 0xFFFF));
		else
			buffer += tfm::format("0x%X", originalValue);
		break;
	default:
		buffer += tfm::format("0x%X", originalValue);
		break;
	}
}